

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::intThresholdPositionDeviationCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
               bool acceptOutOfBoundsAsAnyValue,CompareLogMode logMode)

{
  void **this;
  bool bVar1;
  int iVar2;
  TextureChannelClass TVar3;
  TextureFormat *pTVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  bool bVar7;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  LogImage local_830;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  LogImageSet local_750;
  TextureFormat local_70c;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  LogImage local_6b8;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  LogImage local_5d8;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  LogImage local_4f8;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  LogImageSet local_418;
  MessageBuilder local_3d8;
  MessageBuilder local_258;
  undefined1 local_d4 [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  bool compareOk;
  int numFailingPixels;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  bool acceptOutOfBoundsAsAnyValue_local;
  UVec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  iVar2 = ConstPixelBufferAccess::getWidth(reference);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getHeight(reference);
  errorMaskStorage.m_data.m_cap._0_4_ = ConstPixelBufferAccess::getDepth(reference);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,iVar2,
             errorMaskStorage.m_data.m_cap._4_4_,(int)errorMaskStorage.m_data.m_cap);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  iVar2 = anon_unknown_47::findNumPositionDeviationFailingPixels
                    ((PixelBufferAccess *)local_a0,reference,result,threshold,maxPositionDeviation,
                     acceptOutOfBoundsAsAnyValue);
  bVar7 = iVar2 == 0;
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)local_d4,1.0,1.0,1.0,1.0);
  if ((bVar7) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar4 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_70c,RGBA,UNORM_INT8);
      bVar1 = TextureFormat::operator!=(pTVar4,&local_70c);
      if (bVar1) {
        computePixelScaleBias(result,(Vec4 *)local_d4,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_770,imageSetName,&local_771);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_798,imageSetDesc,&local_799);
      LogImageSet::LogImageSet(&local_750,&local_770,&local_798);
      pTVar6 = TestLog::operator<<(log,&local_750);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"Result",&local_851);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"Result",&local_879);
      LogImage::LogImage(&local_830,&local_850,&local_878,result,(Vec4 *)local_d4,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = TestLog::operator<<(pTVar6,&local_830);
      TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_830);
      std::__cxx11::string::~string((string *)&local_878);
      std::allocator<char>::~allocator(&local_879);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      LogImageSet::~LogImageSet(&local_750);
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator(&local_799);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator(&local_771);
    }
    goto LAB_0126941a;
  }
  pTVar4 = ConstPixelBufferAccess::getFormat(reference);
  TVar3 = getTextureChannelClass(pTVar4->type);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    pTVar4 = ConstPixelBufferAccess::getFormat(result);
    TVar3 = getTextureChannelClass(pTVar4->type);
    if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_01268856;
  }
  else {
LAB_01268856:
    anon_unknown_47::computeScaleAndBias
              (reference,result,(Vec4 *)local_d4,(Vec4 *)(pixelScale.m_data + 2));
    TestLog::operator<<(&local_258,log,(BeginMessageToken *)&TestLog::Message);
    pMVar5 = MessageBuilder::operator<<
                       (&local_258,
                        (char (*) [61])
                        "Result and reference images are normalized with formula p * ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)local_d4);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [4])0x136cffb);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)(pixelScale.m_data + 2));
    MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_258);
  }
  if (!bVar7) {
    TestLog::operator<<(&local_3d8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar5 = MessageBuilder::operator<<(&local_3d8,(char (*) [26])"Image comparison failed:\n");
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [31])"\tallowed position deviation = ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,maxPositionDeviation);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1387264);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [20])"\tcolor threshold = ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,threshold);
    MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_3d8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,imageSetName,&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,imageSetDesc,&local_461);
  LogImageSet::LogImageSet(&local_418,&local_438,&local_460);
  pTVar6 = TestLog::operator<<(log,&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"Result",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"Result",&local_541);
  LogImage::LogImage(&local_4f8,&local_518,&local_540,result,(Vec4 *)local_d4,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"Reference",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Reference",&local_621);
  LogImage::LogImage(&local_5d8,&local_5f8,&local_620,reference,(Vec4 *)local_d4,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"ErrorMask",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"Error mask",&local_701);
  LogImage::LogImage(&local_6b8,&local_6d8,&local_700,(ConstPixelBufferAccess *)local_a0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_6b8);
  TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
  LogImage::~LogImage(&local_6b8);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  LogImage::~LogImage(&local_5d8);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  LogImage::~LogImage(&local_4f8);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  LogImageSet::~LogImageSet(&local_418);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
LAB_0126941a:
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return bVar7;
}

Assistant:

bool intThresholdPositionDeviationCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue, CompareLogMode logMode)
{
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	const int			numFailingPixels	= findNumPositionDeviationFailingPixels(errorMask, reference, result, threshold, maxPositionDeviation, acceptOutOfBoundsAsAnyValue);
	const bool			compareOk			= numFailingPixels == 0;
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log	<< TestLog::Message
				<< "Image comparison failed:\n"
				<< "\tallowed position deviation = " << maxPositionDeviation << "\n"
				<< "\tcolor threshold = " << threshold
				<< TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}